

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlType xVar2;
  xmlParserInputPtr in;
  attributeDeclSAXFunc p_Var3;
  xmlChar *value;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *fullattr;
  char *msg;
  xmlParserErrors error;
  xmlEnumerationPtr tree;
  xmlChar *defaultValue;
  xmlEnumerationPtr local_48;
  int local_3c;
  xmlChar *local_38;
  
  xVar2 = ctxt->mlType;
  if (((((((xVar2 != XML_TYPE_XML) || (pxVar7 = ctxt->input->cur, *pxVar7 != '<')) ||
         (pxVar7[1] != '!')) ||
        (((pxVar7[2] != 'A' || (pxVar7[3] != 'T')) ||
         ((pxVar7[4] != 'T' || ((pxVar7[5] != 'L' || (pxVar7[6] != 'I')))))))) || (pxVar7[7] != 'S')
       ) || (pxVar7[8] != 'T')) &&
     ((((xVar2 != XML_TYPE_SML || (pxVar7 = ctxt->input->cur, *pxVar7 != '!')) || (pxVar7[1] != 'A')
       ) || (((pxVar7[2] != 'T' || (pxVar7[3] != 'T')) ||
             (((pxVar7[4] != 'L' || ((pxVar7[5] != 'I' || (pxVar7[6] != 'S')))) ||
              (pxVar7[7] != 'T')))))))) {
    return;
  }
  in = ctxt->input;
  local_3c = in->id;
  pxVar7 = in->cur;
  in->cur = pxVar7 + (ulong)(xVar2 == XML_TYPE_XML) + 8;
  in->col = (uint)(xVar2 == XML_TYPE_XML) + in->col + 8;
  if (pxVar7[(ulong)(xVar2 == XML_TYPE_XML) + 8] == '\0') {
    xmlParserInputGrow(in,0xfa);
  }
  iVar4 = xmlSkipBlankChars(ctxt);
  if (iVar4 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'<!ATTLIST\'\n");
  }
  pxVar7 = xmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"ATTLIST: no name for Element\n");
    return;
  }
  xmlSkipBlankChars(ctxt);
  while( true ) {
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->mlType == XML_TYPE_SML) {
      xVar1 = *ctxt->input->cur;
      if ((xVar1 == '\n') || (xVar1 == ';')) goto LAB_0016208f;
    }
    else if ((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '>')) goto LAB_0016208f;
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0016208f;
    local_38 = (xmlChar *)0x0;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    local_48 = (xmlEnumerationPtr)0x0;
    fullattr = xmlParseName(ctxt);
    if (fullattr == (xmlChar *)0x0) break;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    iVar4 = xmlSkipBlankChars(ctxt);
    if (iVar4 == 0) {
      msg = "Space required after the attribute name\n";
      error = XML_ERR_SPACE_REQUIRED;
      goto LAB_0016203e;
    }
    iVar4 = xmlParseAttributeType(ctxt,&local_48);
    if (iVar4 < 1) goto LAB_0016208f;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    iVar5 = xmlSkipBlankChars(ctxt);
    if (iVar5 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the attribute type\n");
      goto LAB_00162080;
    }
    iVar5 = xmlParseDefaultDecl(ctxt,&local_38);
    value = local_38;
    if (local_38 != (xmlChar *)0x0 && iVar4 != 1) {
      xmlAttrNormalizeSpace(local_38,local_38);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->mlType == XML_TYPE_SML) {
      xVar1 = *ctxt->input->cur;
      if ((xVar1 != '\n') && (xVar1 != ';')) goto LAB_00161f3d;
    }
    else if ((ctxt->mlType != XML_TYPE_XML) || (*ctxt->input->cur != '>')) {
LAB_00161f3d:
      iVar6 = xmlSkipBlankChars(ctxt);
      if (iVar6 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,
                       "Space required after the attribute default value\n");
        if (value != (xmlChar *)0x0) {
          (*xmlFree)(value);
        }
LAB_00162080:
        if (local_48 != (xmlEnumerationPtr)0x0) {
          xmlFreeEnumeration(local_48);
        }
LAB_0016208f:
        if (ctxt->mlType == XML_TYPE_SML) {
          xVar1 = *ctxt->input->cur;
          if ((xVar1 != ';') && (xVar1 != '\n')) {
            return;
          }
        }
        else {
          if (ctxt->mlType != XML_TYPE_XML) {
            return;
          }
          if (*ctxt->input->cur != '>') {
            return;
          }
        }
        if (local_3c != ctxt->input->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Attribute list declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        return;
      }
    }
    if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
       (p_Var3 = ctxt->sax->attributeDecl, p_Var3 == (attributeDeclSAXFunc)0x0)) {
      if (local_48 != (xmlEnumerationPtr)0x0) {
        xmlFreeEnumeration(local_48);
      }
    }
    else {
      (*p_Var3)(ctxt->userData,pxVar7,fullattr,iVar4,iVar5,value,local_48);
    }
    if (iVar5 - 4U < 0xfffffffe && (ctxt->sax2 != 0 && value != (xmlChar *)0x0)) {
      xmlAddDefAttrs(ctxt,pxVar7,fullattr,value);
    }
    if (ctxt->sax2 != 0) {
      xmlAddSpecialAttr(ctxt,pxVar7,fullattr,iVar4);
    }
    if (value != (xmlChar *)0x0) {
      (*xmlFree)(value);
    }
  }
  msg = "ATTLIST: no name for Attribute\n";
  error = XML_ERR_NAME_REQUIRED;
LAB_0016203e:
  xmlFatalErrMsg(ctxt,error,msg);
  goto LAB_0016208f;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    DEBUG_ENTER(("xmlParseAttributeListDecl(%s);\n", dbgCtxt(ctxt)));

    if (CMP9_MLI(CUR_PTR, '<', '!', 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    RETURN();
	}
	SKIP_BLANKS;
	GROW;
	while ((!RAW_IS_GT_MLI) && (ctxt->instate != XML_PARSER_EOF)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (!RAW_IS_GT_MLI) { /* RAW != '>' */
		if (SKIP_BLANKS == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW_IS_GT_MLI) { /* RAW == '>' */
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
    RETURN();
}